

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch_impl.h
# Opt level: O3

bool RecFindRoots<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
               (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *stack,size_t pos,vector<unsigned_int,_std::allocator<unsigned_int>_> *roots,
               bool fully_factorizable,int depth,Elem randv,
               Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
               *field)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *mod;
  undefined4 *puVar1;
  Elem EVar2;
  long lVar3;
  pointer puVar4;
  pointer puVar5;
  undefined7 in_register_00000009;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *pFVar6;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *pFVar7;
  uint *puVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *extraout_RDX;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *extraout_RDX_00;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *pFVar12;
  pointer puVar13;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *field_00;
  ulong uVar14;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *pFVar15;
  iterator iVar16;
  ulong uVar17;
  pointer puVar18;
  long lVar19;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *this_00;
  int iVar20;
  pointer pvVar21;
  long in_FS_OFFSET;
  bool bVar22;
  undefined4 in_stack_fffffffffffffd78;
  uint local_23c;
  Elem sol;
  uint auStack_1f8 [16];
  uint auStack_1b8 [16];
  uint auStack_178 [16];
  uint auStack_138 [16];
  uint auStack_f8 [16];
  uint auStack_b8 [16];
  uint auStack_78 [16];
  long local_38;
  
  uVar10 = (uint)CONCAT71(in_register_00000009,fully_factorizable);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar21 = (stack->
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  puVar8 = pvVar21[pos].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)*(pointer *)
                 ((long)&pvVar21[pos].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data + 8) - (long)puVar8 >> 2;
  if (lVar3 == 3) {
    if (puVar8[1] != 0) {
      uVar10 = *puVar8;
      EVar2 = anon_unknown.dwarf_4126dac::
              Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
              ::Inv((Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                     *)(ulong)puVar8[1],(Elem)pos);
      uVar9 = EVar2 >> 10 & 0x7c;
      EVar2 = anon_unknown.dwarf_4126dac::
              Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
              ::Mul((Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                     *)(ulong)uVar10,
                    *(uint *)((anonymous_namespace)::SQR_TABLE_32 +
                             (ulong)(EVar2 >> 4 & 0xfc) + 0x100) ^
                    *(uint *)((anonymous_namespace)::SQR_TABLE_32 + (ulong)(EVar2 & 0x3f) * 4) ^
                    *(uint *)((anonymous_namespace)::SQR_TABLE_32 + (ulong)uVar9 + 0x200) ^
                    *(uint *)((anonymous_namespace)::SQR_TABLE_32 +
                             (ulong)(EVar2 >> 0xf & 0x7c) + 0x280) ^
                    *(uint *)((anonymous_namespace)::SQR_TABLE_32 +
                             (ulong)(EVar2 >> 0x14 & 0x7c) + 0x300) ^
                    *(uint *)((anonymous_namespace)::SQR_TABLE_32 +
                             (ulong)(EVar2 >> 0x1b) * 4 + 0x380),uVar9);
      uVar9 = *(uint *)((anonymous_namespace)::QRT_TABLE_32 + (ulong)(EVar2 >> 4 & 0xfc) + 0x100) ^
              *(uint *)((anonymous_namespace)::QRT_TABLE_32 + (ulong)(EVar2 & 0x3f) * 4) ^
              *(uint *)((anonymous_namespace)::QRT_TABLE_32 + (ulong)(EVar2 >> 10 & 0x7c) + 0x200) ^
              *(uint *)((anonymous_namespace)::QRT_TABLE_32 + (ulong)(EVar2 >> 0xf & 0x7c) + 0x280)
              ^ *(uint *)((anonymous_namespace)::QRT_TABLE_32 +
                         (ulong)(EVar2 >> 0x14 & 0x7c) + 0x300) ^
              *(uint *)((anonymous_namespace)::QRT_TABLE_32 + (ulong)(EVar2 >> 0x1b) * 4 + 0x380);
      uVar10 = uVar9 >> 4 & 0xfc;
      if ((*(uint *)((anonymous_namespace)::SQR_TABLE_32 + (ulong)(uVar9 & 0x3f) * 4) ^
           *(uint *)((anonymous_namespace)::SQR_TABLE_32 + (ulong)uVar10 + 0x100) ^
           *(uint *)((anonymous_namespace)::SQR_TABLE_32 + (ulong)(uVar9 >> 10 & 0x7c) + 0x200) ^
           *(uint *)((anonymous_namespace)::SQR_TABLE_32 + (ulong)(uVar9 >> 0xf & 0x7c) + 0x280) ^
           *(uint *)((anonymous_namespace)::SQR_TABLE_32 + (ulong)(uVar9 >> 0x14 & 0x7c) + 0x300) ^
           *(uint *)((anonymous_namespace)::SQR_TABLE_32 + (ulong)(uVar9 >> 0x1b) * 4 + 0x380) ^
          uVar9) == EVar2) {
        sol = anon_unknown.dwarf_4126dac::
              Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
              ::Mul((Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                     *)(ulong)uVar9,
                    *(Elem *)(*(long *)&pvVar21[pos].
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data + 4),uVar10);
        iVar16._M_current =
             (roots->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        puVar8 = (roots->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        if (iVar16._M_current == puVar8) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)roots,iVar16,&sol);
          iVar16._M_current =
               (roots->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          puVar8 = (roots->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar16._M_current = sol;
          iVar16._M_current = iVar16._M_current + 1;
          (roots->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar16._M_current;
        }
        uVar10 = sol ^ *(uint *)(*(long *)&pvVar21[pos].
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data + 4);
        local_23c = uVar10;
        if (iVar16._M_current != puVar8) goto LAB_00162d30;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (roots,iVar16,&local_23c);
        goto LAB_00162d3b;
      }
    }
  }
  else {
    if (lVar3 == 2) {
      iVar16._M_current =
           (roots->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar16._M_current ==
          (roots->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)roots,iVar16,puVar8);
      }
      else {
        uVar10 = *puVar8;
LAB_00162d30:
        *iVar16._M_current = uVar10;
        (roots->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar16._M_current + 1;
      }
LAB_00162d3b:
      bVar22 = true;
      goto LAB_00162f45;
    }
    if ((ulong)(((long)(stack->
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar21) / 0x18) <
        pos + 3) {
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::resize(stack,(pos + 3) * 2);
      pvVar21 = (stack->
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    }
    mod = pvVar21 + pos;
    this = pvVar21 + pos + 1;
    puVar4 = pvVar21[pos + 2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (*(pointer *)
         ((long)&pvVar21[pos + 2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data + 8) != puVar4) {
      mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar4;
    }
    puVar4 = (this->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (*(pointer *)
         ((long)&pvVar21[pos + 1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data + 8) != puVar4) {
      *(pointer *)
       ((long)&pvVar21[pos + 1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data + 8) = puVar4;
    }
    this_00 = (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
               *)(pvVar21 + pos + 2);
    puVar4 = (mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pFVar7 = (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
              *)(mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    iVar11 = 0;
    do {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
                 (long)pFVar7 - (long)puVar4 >> 1);
      pFVar7 = (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                *)0x2;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,2);
      puVar1 = *(undefined4 **)this_00;
      *puVar1 = 0;
      puVar1[1] = randv;
      iVar20 = 0x1f;
      do {
        Sqr<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,pFVar7);
        puVar4 = mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pFVar12 = extraout_RDX;
        if ((ulong)((long)mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)puVar4) < 5) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,2);
          puVar4 = *(pointer *)this_00;
          pFVar12 = extraout_RDX_00;
        }
        puVar4[1] = randv;
        pFVar7 = this_00;
        PolyMod<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                  (mod,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,pFVar12);
        iVar20 = iVar20 + -1;
      } while (iVar20 != 0);
      if (iVar11 == 0) {
        if ((uVar10 & 1) != 0) goto LAB_00162bc9;
      }
      else {
        if ((uVar10 & 1) == 0) {
          pFVar7 = this_00;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
          Sqr<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                    (this,pFVar7);
          puVar4 = mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pFVar7 = (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                    *)(this->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start;
          pFVar12 = (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                     *)((long)mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4);
          if (pFVar12 !=
              (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
               *)0x0) {
            pFVar12 = (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                       *)(((long)pFVar12 >> 2) + (ulong)((long)pFVar12 >> 2 == 0));
            pFVar15 = (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                       *)0x0;
            do {
              *(uint *)(pFVar7 + (long)pFVar15 * 4) =
                   *(uint *)(pFVar7 + (long)pFVar15 * 4) ^ puVar4[(long)pFVar15];
              pFVar15 = pFVar15 + 1;
            } while (pFVar12 != pFVar15);
          }
          pFVar15 = *(Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                      **)((long)&pvVar21[pos + 1].
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data + 8);
          if (pFVar15 != pFVar7) {
            pFVar6 = pFVar15 + -4;
            do {
              pFVar15 = pFVar6;
              if (*(int *)pFVar6 != 0) break;
              *(Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                **)((long)&pvVar21[pos + 1].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data + 8) = pFVar6;
              pFVar15 = pFVar6 + -4;
              bVar22 = pFVar6 != pFVar7;
              pFVar6 = pFVar15;
              pFVar12 = pFVar15;
            } while (bVar22);
          }
          PolyMod<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                    (mod,this,pFVar12);
          uVar10 = (uint)CONCAT71((int7)((ulong)pFVar15 >> 8),1);
          if (*(pointer *)
               ((long)&pvVar21[pos + 1].
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data + 8) !=
              (this->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start) goto LAB_00162f43;
        }
LAB_00162bc9:
        if ((-0x20 < depth) &&
           (((long)(mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2) - 2U >> (-((char)depth + ' ') & 0x3fU) !=
            0)) goto LAB_00162f43;
      }
      depth = depth + 1;
      randv = (int)randv >> 0x1f & 0x8dU ^ randv * 2;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(this,mod);
      pFVar7 = (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                *)mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      puVar4 = mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pFVar12 = (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                 *)(this->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
      puVar13 = *(pointer *)
                 ((long)&pvVar21[pos + 1].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data + 8);
      puVar5 = puVar4;
      pFVar15 = pFVar7;
      if ((ulong)((long)puVar13 - (long)pFVar12) <= (ulong)((long)puVar4 - (long)pFVar7))
      goto LAB_00162c68;
      puVar18 = mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pFVar12;
      puVar5 = puVar13;
      pFVar15 = pFVar12;
      while( true ) {
        mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar5;
        mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             *(pointer *)
              ((long)&pvVar21[pos + 1].
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data + 0x10);
        (this->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)pFVar7;
        *(pointer *)
         ((long)&pvVar21[pos + 1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data + 8) = puVar4;
        *(pointer *)
         ((long)&pvVar21[pos + 1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data + 0x10) = puVar18;
        puVar13 = puVar4;
        pFVar12 = pFVar7;
LAB_00162c68:
        lVar3 = (long)puVar13 - (long)pFVar12 >> 2;
        if (lVar3 == 0) goto LAB_00162c90;
        if (lVar3 == 1) break;
        MakeMonic<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                  (this,pFVar12);
        PolyMod<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                  (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,field_00);
        pFVar7 = (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                  *)mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        puVar4 = mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        puVar18 = mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        pFVar15 = (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                   *)(this->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                     .super__Vector_impl_data._M_start;
        mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)pFVar15;
        puVar5 = *(pointer *)
                  ((long)&pvVar21[pos + 1].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data + 8);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,1);
      pFVar15 = (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                 *)mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
      *(uint *)pFVar15 = 1;
      puVar5 = mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
LAB_00162c90:
      puVar4 = (mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pFVar7 = (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                *)(mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      iVar11 = iVar11 + 1;
    } while (((ulong)((long)puVar5 - (long)pFVar15) < 5) ||
            ((long)puVar5 - (long)pFVar15 == (long)pFVar7 - (long)puVar4));
    MakeMonic<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,pFVar7);
    uVar14 = (long)mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    puVar4 = (mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar13 = (mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    uVar17 = (long)puVar13 - (long)puVar4 >> 2;
    if (uVar17 < uVar14) {
      puVar5 = (this->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar21[pos + 1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data + 8) != puVar5) {
        *(pointer *)
         ((long)&pvVar21[pos + 1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data + 8) = puVar5;
      }
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(this,(uVar17 - uVar14) + 1);
      puVar4 = (mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar13 = (mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      lVar3 = (long)puVar13 - (long)puVar4;
      while (uVar14 <= (ulong)(lVar3 >> 2)) {
        uVar9 = puVar13[-1];
        puVar13 = puVar13 + -1;
        lVar3 = (lVar3 >> 2) - uVar14;
        (this->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar3] = uVar9;
        (mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = puVar13;
        if (uVar9 != 0) {
          anon_unknown.dwarf_4126dac::
          Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
          ::Multiplier::Multiplier
                    ((Multiplier *)&sol,
                     (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                      *)(ulong)uVar9,(Elem)lVar3);
          puVar5 = mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar3 = (long)mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 2;
          puVar4 = (mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          puVar13 = (mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
          if (lVar3 != 1) {
            lVar19 = 0;
            do {
              uVar9 = puVar5[lVar19];
              puVar4[(((ulong)((long)puVar13 - (long)puVar4) >> 2) - uVar14) + lVar19 + 1] =
                   puVar4[(((ulong)((long)puVar13 - (long)puVar4) >> 2) - uVar14) + lVar19 + 1] ^
                   *(uint *)((long)auStack_1f8 + (ulong)(uVar9 >> 2 & 0x3c)) ^ (&sol)[uVar9 & 0xf] ^
                   *(uint *)((long)auStack_1b8 + (ulong)(uVar9 >> 6 & 0x3c)) ^
                   *(uint *)((long)auStack_178 + (ulong)(uVar9 >> 10 & 0x3c)) ^
                   *(uint *)((long)auStack_138 + (ulong)(uVar9 >> 0xe & 0x3c)) ^
                   *(uint *)((long)auStack_f8 + (ulong)(uVar9 >> 0x12 & 0x3c)) ^
                   *(uint *)((long)auStack_b8 + (ulong)(uVar9 >> 0x16 & 0x3c)) ^
                   auStack_78[uVar9 >> 0x1c];
              lVar19 = lVar19 + 1;
            } while (lVar3 + -1 != lVar19);
          }
        }
        lVar3 = (long)puVar13 - (long)puVar4;
      }
    }
    puVar5 = (mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    puVar18 = mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_start =
         mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    (mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar18;
    (mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = puVar4;
    mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar13;
    mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar5;
    bVar22 = RecFindRoots<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                       (stack,pos + 1,roots,(bool)((byte)uVar10 & 1),depth,randv,
                        (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                         *)CONCAT44(uVar10,in_stack_fffffffffffffd78));
    if (bVar22) {
      bVar22 = RecFindRoots<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                         (stack,pos,roots,true,depth,randv,
                          (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                           *)CONCAT44(uVar10,in_stack_fffffffffffffd78));
      goto LAB_00162f45;
    }
  }
LAB_00162f43:
  bVar22 = false;
LAB_00162f45:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar22;
  }
  __stack_chk_fail();
}

Assistant:

bool RecFindRoots(std::vector<std::vector<typename F::Elem>>& stack, size_t pos, std::vector<typename F::Elem>& roots, bool fully_factorizable, int depth, typename F::Elem randv, const F& field) {
    auto& ppoly = stack[pos];
    // We assert ppoly.size() > 1 (instead of just ppoly.size() > 0) to additionally exclude
    // constants polynomials because
    //  - ppoly is not constant initially (this is ensured by FindRoots()), and
    //  - we never recurse on a constant polynomial.
    CHECK_SAFE(ppoly.size() > 1 && ppoly.back() == 1);
    /* 1st degree input: constant term is the root. */
    if (ppoly.size() == 2) {
        roots.push_back(ppoly[0]);
        return true;
    }
    /* 2nd degree input: use direct quadratic solver. */
    if (ppoly.size() == 3) {
        CHECK_RETURN(ppoly[1] != 0, false); // Equations of the form (x^2 + a) have two identical solutions; contradicts square-free assumption. */
        auto input = field.Mul(ppoly[0], field.Sqr(field.Inv(ppoly[1])));
        auto root = field.Qrt(input);
        if ((field.Sqr(root) ^ root) != input) {
            CHECK_SAFE(!fully_factorizable);
            return false; // No root found.
        }
        auto sol = field.Mul(root, ppoly[1]);
        roots.push_back(sol);
        roots.push_back(sol ^ ppoly[1]);
        return true;
    }
    /* 3rd degree input and more: recurse further. */
    if (pos + 3 > stack.size()) {
        // Allocate memory if necessary.
        stack.resize((pos + 3) * 2);
    }
    auto& poly = stack[pos];
    auto& tmp = stack[pos + 1];
    auto& trace = stack[pos + 2];
    trace.clear();
    tmp.clear();
    for (int iter = 0;; ++iter) {
        // Compute the polynomial (trace(x*randv) mod poly(x)) symbolically,
        // and put the result in `trace`.
        TraceMod(poly, trace, randv, field);

        if (iter >= 1 && !fully_factorizable) {
            // If the polynomial cannot be factorized completely (it has an
            // irreducible factor of degree higher than 1), we want to avoid
            // the case where this is only detected after trying all BITS
            // independent split attempts fail (see the assert below).
            //
            // Observe that if we call y = randv*x, it is true that:
            //
            //   trace = y + y^2 + y^4 + y^8 + ... y^(FIELDSIZE/2) mod poly
            //
            // Due to the Frobenius endomorphism, this means:
            //
            //   trace^2 = y^2 + y^4 + y^8 + ... + y^FIELDSIZE mod poly
            //
            // Or, adding them up:
            //
            //   trace + trace^2 = y + y^FIELDSIZE mod poly.
            //                   = randv*x + randv^FIELDSIZE*x^FIELDSIZE
            //                   = randv*x + randv*x^FIELDSIZE
            //                   = randv*(x + x^FIELDSIZE).
            //     (all mod poly)
            //
            // x + x^FIELDSIZE is the polynomial which has every field element
            // as root once. Whenever x + x^FIELDSIZE is multiple of poly,
            // this means it only has unique first degree factors. The same
            // holds for its constant multiple randv*(x + x^FIELDSIZE) =
            // trace + trace^2.
            //
            // We use this test to quickly verify whether the polynomial is
            // fully factorizable after already having computed a trace.
            // We don't invoke it immediately; only when splitting has failed
            // at least once, which avoids it for most polynomials that are
            // fully factorizable (or at least pushes the test down the
            // recursion to factors which are smaller and thus faster).
            tmp = trace;
            Sqr(tmp, field);
            for (size_t i = 0; i < trace.size(); ++i) {
                tmp[i] ^= trace[i];
            }
            while (tmp.size() && tmp.back() == 0) tmp.pop_back();
            PolyMod(poly, tmp, field);

            // Whenever the test fails, we can immediately abort the root
            // finding. Whenever it succeeds, we can remember and pass down
            // the information that it is in fact fully factorizable, avoiding
            // the need to run the test again.
            if (tmp.size() != 0) return false;
            fully_factorizable = true;
        }

        if (fully_factorizable) {
            // Every successful iteration of this algorithm splits the input
            // polynomial further into buckets, each corresponding to a subset
            // of 2^(BITS-depth) roots. If after depth splits the degree of
            // the polynomial is >= 2^(BITS-depth), something is wrong.
            CHECK_RETURN(field.Bits() - depth >= std::numeric_limits<decltype(poly.size())>::digits ||
                (poly.size() - 2) >> (field.Bits() - depth) == 0, false);
        }

        depth++;
        // In every iteration we multiply randv by 2. As a result, the set
        // of randv values forms a GF(2)-linearly independent basis of splits.
        randv = field.Mul2(randv);
        tmp = poly;
        GCD(trace, tmp, field);
        if (trace.size() != poly.size() && trace.size() > 1) break;
    }
    MakeMonic(trace, field);
    DivMod(trace, poly, tmp, field);
    // At this point, the stack looks like [... (poly) tmp trace], and we want to recursively
    // find roots of trace and tmp (= poly/trace). As we don't care about poly anymore, move
    // trace into its position first.
    std::swap(poly, trace);
    // Now the stack is [... (trace) tmp ...]. First we factor tmp (at pos = pos+1), and then
    // we factor trace (at pos = pos).
    if (!RecFindRoots(stack, pos + 1, roots, fully_factorizable, depth, randv, field)) return false;
    // The stack position pos contains trace, the polynomial with all of poly's roots which (after
    // multiplication with randv) have trace 0. This is never the case for irreducible factors
    // (which always end up in tmp), so we can set fully_factorizable to true when recursing.
    bool ret = RecFindRoots(stack, pos, roots, true, depth, randv, field);
    // Because of the above, recursion can never fail here.
    CHECK_SAFE(ret);
    return ret;
}